

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElHCurl.cpp
# Opt level: O2

void __thiscall
TPZCompElHCurl<pzshape::TPZShapeLinear>::~TPZCompElHCurl
          (TPZCompElHCurl<pzshape::TPZShapeLinear> *this,void **vtt)

{
  void *pvVar1;
  TPZGeoEl *pTVar2;
  TPZGeoEl *pTVar3;
  TPZConnect *pTVar4;
  long lVar5;
  TPZStack<long,_10> connectlist;
  
  pvVar1 = *vtt;
  *(void **)&(this->super_TPZIntelGen<pzshape::TPZShapeLinear>).super_TPZInterpolatedElement.
             super_TPZInterpolationSpace.super_TPZCompEl = pvVar1;
  *(void **)((long)(this->fConnectIndexes).fExtAlloc + *(long *)((long)pvVar1 + -0x60) + -0x68) =
       vtt[9];
  pTVar2 = TPZCompEl::Reference((TPZCompEl *)this);
  if (pTVar2 != (TPZGeoEl *)0x0) {
    if ((TPZCompElHCurl<pzshape::TPZShapeLinear> *)pTVar2->fReference != this) goto LAB_010d31dc;
    (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeLinear>).
                           super_TPZInterpolatedElement.super_TPZInterpolationSpace.super_TPZCompEl
                + 0x358))(this,1);
    pTVar3 = TPZCompEl::Reference((TPZCompEl *)this);
    pTVar3->fReference = (TPZCompEl *)0x0;
  }
  TPZStack<long,_10>::TPZStack(&connectlist);
  (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeLinear>).
                         super_TPZInterpolatedElement.super_TPZInterpolationSpace.super_TPZCompEl +
              0x1e0))(this,&connectlist);
  lVar5 = 0;
  if (connectlist.super_TPZManVector<long,_10>.super_TPZVec<long>.fNElements < 1) {
    connectlist.super_TPZManVector<long,_10>.super_TPZVec<long>.fNElements = lVar5;
  }
  for (; connectlist.super_TPZManVector<long,_10>.super_TPZVec<long>.fNElements != lVar5;
      lVar5 = lVar5 + 1) {
    if (connectlist.super_TPZManVector<long,_10>.super_TPZVec<long>.fStore[lVar5] != -1) {
      pTVar4 = TPZChunkVector<TPZConnect,_10>::operator[]
                         (&(((this->super_TPZIntelGen<pzshape::TPZShapeLinear>).
                             super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                             super_TPZCompEl.fMesh)->fConnectVec).
                           super_TPZChunkVector<TPZConnect,_10>,
                          connectlist.super_TPZManVector<long,_10>.super_TPZVec<long>.fStore[lVar5])
      ;
      pTVar4->fNElConnected = pTVar4->fNElConnected + -1;
    }
  }
  if (pTVar2 != (TPZGeoEl *)0x0) {
    pTVar2->fReference = (TPZCompEl *)0x0;
  }
  TPZManVector<long,_10>::~TPZManVector(&connectlist.super_TPZManVector<long,_10>);
LAB_010d31dc:
  TPZManVector<long,_1>::~TPZManVector(&this->fConnectIndexes);
  TPZInterpolatedElement::~TPZInterpolatedElement((TPZInterpolatedElement *)this,vtt + 2);
  return;
}

Assistant:

TPZCompElHCurl<TSHAPE>::~TPZCompElHCurl(){
    TPZGeoEl *gel = this->Reference();
    if (gel && gel->Reference() != this) {
        return;
    }
    if (gel) {
        TPZCompEl *cel = gel->Reference();
        if (cel == this) {
            this->RemoveSideRestraintsII(TPZInterpolatedElement::MInsertMode::EDelete);
        }
        this->Reference()->ResetReference();
    }
    TPZStack<int64_t > connectlist;
    this->BuildConnectList(connectlist);
    int64_t nconnects = connectlist.size();
    for (int ic = 0; ic < nconnects; ic++) {
        if (connectlist[ic] != -1){
            this->fMesh->ConnectVec()[connectlist[ic]].DecrementElConnected();
        }
    }
    if (gel){
        gel->ResetReference();
    }
}